

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

void __thiscall
gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::~bufferCollection(bufferCollection *this)

{
  pointer ppVar1;
  Buffer *this_00;
  pointer ppVar2;
  
  ppVar1 = (this->m_vector).
           super__Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar2 = (this->m_vector).
                super__Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair>_>
                ._M_impl.super__Vector_impl_data._M_start; ppVar2 != ppVar1; ppVar2 = ppVar2 + 1) {
    this_00 = ppVar2->m_buffer;
    if (this_00 != (Buffer *)0x0) {
      Utils::Buffer::~Buffer(this_00);
      operator_delete(this_00,0x10);
      ppVar2->m_buffer = (Buffer *)0x0;
    }
  }
  std::
  _Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair>_>
  ::~_Vector_base((_Vector_base<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair,_std::allocator<gl4cts::EnhancedLayouts::BufferTestBase::bufferCollection::pair>_>
                   *)this);
  return;
}

Assistant:

BufferTestBase::bufferCollection::~bufferCollection()
{
	for (Vector::iterator it = m_vector.begin(), end = m_vector.end(); end != it; ++it)
	{
		if (0 != it->m_buffer)
		{
			delete it->m_buffer;
			it->m_buffer = 0;
		}
	}
}